

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::Anchor(void)

{
  int iVar1;
  RegEx *in_stack_ffffffffffffff98;
  RegEx *in_stack_ffffffffffffffa0;
  RegEx *in_stack_ffffffffffffffa8;
  REGEX_OP in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  RegEx *in_stack_ffffffffffffffc0;
  
  if (Anchor()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&Anchor()::e);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffa0,"[]{},",(allocator *)&stack0xffffffffffffff9f);
      RegEx::RegEx(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
      BlankOrBreak();
      operator|(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      operator!(in_stack_ffffffffffffff98);
      RegEx::~RegEx((RegEx *)0xf22506);
      RegEx::~RegEx((RegEx *)0xf22510);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
      __cxa_atexit(RegEx::~RegEx,&Anchor::e,&__dso_handle);
      __cxa_guard_release(&Anchor()::e);
    }
  }
  return &Anchor::e;
}

Assistant:

inline const RegEx& Anchor() {
  static const RegEx e = !(RegEx("[]{},", REGEX_OR) | BlankOrBreak());
  return e;
}